

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::f_formatter<spdlog::details::scoped_padder>::format
          (f_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  scoped_padder p;
  scoped_padder local_60;
  byte abStack_2a [5];
  undefined2 local_25;
  char local_23 [3];
  char *local_20;
  
  lVar1 = (msg->time).__d.__r;
  uVar7 = (lVar1 / 1000000000) * -1000000 + lVar1 / 1000;
  scoped_padder::scoped_padder(&local_60,6,&(this->super_flag_formatter).padinfo_,dest);
  lVar1 = 0x3f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar4 = (uint)(byte)::fmt::v9::detail::do_count_digits(unsigned_long)::bsr2log10[lVar1] -
          (uint)(uVar7 < *(ulong *)(::fmt::v9::detail::do_count_digits(unsigned_long)::
                                    zero_or_powers_of_10 +
                                   (ulong)(byte)::fmt::v9::detail::do_count_digits(unsigned_long)::
                                                bsr2log10[lVar1] * 8));
  if (uVar4 < 6) {
    iVar5 = 6 - uVar4;
    do {
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar2 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar2 + 1;
      (dest->super_buffer<char>).ptr_[sVar2] = '0';
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  pcVar6 = local_23;
  uVar8 = uVar7;
  if (99 < uVar7) {
    do {
      uVar7 = uVar8 / 100;
      *(undefined2 *)(pcVar6 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar8 % 100) * 2);
      pcVar6 = pcVar6 + -2;
      bVar3 = 9999 < uVar8;
      uVar8 = uVar7;
    } while (bVar3);
  }
  if (uVar7 < 10) {
    pcVar6[-1] = (byte)uVar7 | 0x30;
    local_20 = pcVar6 + -1;
  }
  else {
    *(undefined2 *)(pcVar6 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar7 * 2);
    local_20 = pcVar6 + -2;
  }
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_20,local_23);
  scoped_padder::~scoped_padder(&local_60);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }